

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandShowBdd(Abc_Frame_t *pAbc,int argc,char **argv)

{
  long *plVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pNode;
  char *pcVar3;
  char *format;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iVar2 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar2 == -1) {
    if (pNtk == (Abc_Ntk_t *)0x0) {
      pcVar3 = "Empty network.\n";
    }
    else {
      if ((pNtk->ntkFunc == ABC_FUNC_BDD) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
        if (argc <= globalUtilOptind + 1) {
          if (globalUtilOptind == argc) {
            if (pNtk->vPos->nSize < 1) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            plVar1 = (long *)*pNtk->vPos->pArray;
            pNode = *(Abc_Obj_t **)
                     (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
            if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
LAB_002046f4:
              Abc_NodeShowBdd(pNode);
              return 0;
            }
            pcVar3 = Abc_ObjName(pNode);
            format = "The driver \"%s\" of the first PO is not an internal node.\n";
          }
          else {
            pNode = Abc_NtkFindNode(pNtk,argv[globalUtilOptind]);
            if (pNode != (Abc_Obj_t *)0x0) goto LAB_002046f4;
            pcVar3 = argv[globalUtilOptind];
            format = "Cannot find node \"%s\".\n";
          }
          Abc_Print(-1,format,pcVar3);
          return 1;
        }
        Abc_Print(-1,"Wrong number of auguments.\n");
        goto LAB_002045e9;
      }
      pcVar3 = "Visualizing BDDs can only be done for logic BDD networks (run \"bdd\").\n";
    }
    iVar2 = -1;
  }
  else {
LAB_002045e9:
    Abc_Print(-2,"usage: show_bdd [-h] <node>\n");
    Abc_Print(-2,"       visualizes the BDD of a node using DOT and GSVIEW\n");
    Abc_Print(-2,"\t<node>: the node to consider [default = the driver of the first PO]\n");
    pcVar3 = "\t-h    : print the command usage\n";
    iVar2 = -2;
  }
  Abc_Print(iVar2,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandShowBdd( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pNode;
    int c;
    extern void Abc_NodeShowBdd( Abc_Obj_t * pNode );

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsBddLogic(pNtk) )
    {
        Abc_Print( -1, "Visualizing BDDs can only be done for logic BDD networks (run \"bdd\").\n" );
        return 1;
    }

    if ( argc > globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }
    if ( argc == globalUtilOptind )
    {
        pNode = Abc_ObjFanin0( Abc_NtkPo(pNtk, 0) );
        if ( !Abc_ObjIsNode(pNode) )
        {
            Abc_Print( -1, "The driver \"%s\" of the first PO is not an internal node.\n", Abc_ObjName(pNode) );
            return 1;
        }
    }
    else
    {
        pNode = Abc_NtkFindNode( pNtk, argv[globalUtilOptind] );
        if ( pNode == NULL )
        {
            Abc_Print( -1, "Cannot find node \"%s\".\n", argv[globalUtilOptind] );
            return 1;
        }
    }
    Abc_NodeShowBdd( pNode );
    return 0;

usage:
    Abc_Print( -2, "usage: show_bdd [-h] <node>\n" );
    Abc_Print( -2, "       visualizes the BDD of a node using DOT and GSVIEW\n" );
#ifdef WIN32
    Abc_Print( -2, "       \"dot.exe\" and \"gsview32.exe\" should be set in the paths\n" );
    Abc_Print( -2, "       (\"gsview32.exe\" may be in \"C:\\Program Files\\Ghostgum\\gsview\\\")\n" );
#endif
    Abc_Print( -2, "\t<node>: the node to consider [default = the driver of the first PO]\n");
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}